

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O0

String * __thiscall
Jinx::Impl::Parser::ParseName_abi_cxx11_(String *__return_storage_ptr__,Parser *this)

{
  pointer pSVar1;
  bool local_22;
  __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
  local_20;
  Parser *local_18;
  Parser *this_local;
  String *s;
  
  local_22 = true;
  local_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  if ((this->m_error & 1U) == 0) {
    local_20._M_current =
         (Symbol *)
         std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::end
                   (this->m_symbolList);
    local_22 = __gnu_cxx::operator==(&this->m_currentSymbol,&local_20);
  }
  if (local_22 == false) {
    pSVar1 = __gnu_cxx::
             __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
             ::operator->(&this->m_currentSymbol);
    if (pSVar1->type == NameValue) {
      pSVar1 = __gnu_cxx::
               __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
               ::operator->(&this->m_currentSymbol);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
                (__return_storage_ptr__,&pSVar1->text);
      NextSymbol(this);
    }
    else {
      Error<>(this,"Unexpected symbol type when parsing name");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
                (__return_storage_ptr__);
    }
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline String Parser::ParseName()
	{
		if (m_error || m_currentSymbol == m_symbolList.end())
			return String();
		if (m_currentSymbol->type != SymbolType::NameValue)
		{
			Error("Unexpected symbol type when parsing name");
			return String();
		}
		String s = String(m_currentSymbol->text);
		NextSymbol();
		return s;
	}